

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_namenode_client.cc
# Opt level: O2

Future<RemoveResponse> * __thiscall
NarpcNamenodeClient::Remove
          (Future<RemoveResponse> *__return_storage_ptr__,NarpcNamenodeClient *this,Filename *name,
          bool recursive)

{
  int iVar1;
  shared_ptr<NarpcRemoveResponse> response;
  shared_ptr<RemoveRequest> request;
  __shared_ptr<NarpcRemoveResponse,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<RemoveRequest,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<AsyncTask<RemoveResponse>,(__gnu_cxx::_Lock_policy)2> local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  RpcClient *local_30;
  
  std::make_shared<RemoveRequest,crail::Filename&,bool&>((Filename *)&local_70,(bool *)name);
  local_30 = &this->rpc_client_;
  std::make_shared<NarpcRemoveResponse,RpcClient*>((RpcClient **)&local_80);
  std::__shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<RemoveRequest,void>
            (local_40,&local_70);
  std::__shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<NarpcRemoveResponse,void>
            (local_50,&local_80);
  iVar1 = RpcClient::IssueRequest
                    (&this->rpc_client_,(shared_ptr<RpcMessage> *)local_40,
                     (shared_ptr<RpcMessage> *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  if (iVar1 < 0) {
    Future<RemoveResponse>::Future(__return_storage_ptr__);
  }
  else {
    std::__shared_ptr<AsyncTask<RemoveResponse>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<NarpcRemoveResponse,void>(local_60,&local_80);
    Future<RemoveResponse>::Future
              (__return_storage_ptr__,(shared_ptr<AsyncTask<RemoveResponse>_> *)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Future<RemoveResponse> NarpcNamenodeClient::Remove(Filename &name,
                                                   bool recursive) {
  shared_ptr<RemoveRequest> request =
      make_shared<RemoveRequest>(name, recursive);
  shared_ptr<NarpcRemoveResponse> response =
      make_shared<NarpcRemoveResponse>(&rpc_client_);

  if (rpc_client_.IssueRequest(request, response) < 0) {
    return Future<RemoveResponse>::Failure();
  }
  return Future<RemoveResponse>(response);
}